

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O0

void deThread_destroy(deThread threadptr)

{
  int ret;
  Thread *thread;
  deThread threadptr_local;
  
  if (*(long *)threadptr != 0) {
    pthread_detach(*(pthread_t *)threadptr);
  }
  deFree((void *)threadptr);
  return;
}

Assistant:

void deThread_destroy (deThread threadptr)
{
	Thread* thread = (Thread*)threadptr;

	if (thread->thread)
	{
		/* Not joined, detach. */
		int ret = pthread_detach(thread->thread);
		DE_ASSERT(ret == 0);
		DE_UNREF(ret);
	}

	deFree(thread);
}